

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorProto::InternalSwap(DescriptorProto *this,DescriptorProto *other)

{
  uint32 uVar1;
  void *pvVar2;
  string *psVar3;
  MessageOptions *pMVar4;
  UnknownFieldSet *other_00;
  
  pvVar2 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_002b9db9;
LAB_002b9dac:
    other_00 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_002b9dac;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002b9db9:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->field_).super_RepeatedPtrFieldBase,&(other->field_).super_RepeatedPtrFieldBase)
  ;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->nested_type_).super_RepeatedPtrFieldBase,
             &(other->nested_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(other->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->extension_range_).super_RepeatedPtrFieldBase,
             &(other->extension_range_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(other->extension_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->oneof_decl_).super_RepeatedPtrFieldBase,
             &(other->oneof_decl_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->reserved_range_).super_RepeatedPtrFieldBase,
             &(other->reserved_range_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->reserved_name_).super_RepeatedPtrFieldBase,
             &(other->reserved_name_).super_RepeatedPtrFieldBase);
  psVar3 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar3;
  pMVar4 = this->options_;
  this->options_ = other->options_;
  other->options_ = pMVar4;
  return;
}

Assistant:

void DescriptorProto::InternalSwap(DescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  field_.InternalSwap(&other->field_);
  nested_type_.InternalSwap(&other->nested_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  extension_range_.InternalSwap(&other->extension_range_);
  extension_.InternalSwap(&other->extension_);
  oneof_decl_.InternalSwap(&other->oneof_decl_);
  reserved_range_.InternalSwap(&other->reserved_range_);
  reserved_name_.InternalSwap(&other->reserved_name_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
}